

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O3

void __thiscall muduo::Thread::setDefaultName(Thread *this)

{
  char *pcVar1;
  int iVar2;
  char buf [32];
  char acStack_38 [32];
  
  iVar2 = numCreated_;
  LOCK();
  numCreated_ = numCreated_ + 1;
  UNLOCK();
  if ((this->name_)._M_string_length != 0) {
    return;
  }
  snprintf(acStack_38,0x20,"Thread%d",(ulong)(iVar2 + 1));
  pcVar1 = (char *)(this->name_)._M_string_length;
  strlen(acStack_38);
  std::__cxx11::string::_M_replace((ulong)&this->name_,0,pcVar1,(ulong)acStack_38);
  return;
}

Assistant:

void Thread::setDefaultName()
{
  int num = numCreated_.incrementAndGet();
  if (name_.empty())
  {
    char buf[32];
    snprintf(buf, sizeof buf, "Thread%d", num);
    name_ = buf;
  }
}